

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int renameColumnSelectCb(Walker *pWalker,Select *p)

{
  if ((p->selFlags & 0x4200000) != 0) {
    return 1;
  }
  renameWalkWith(pWalker,p);
  return 0;
}

Assistant:

static int renameColumnSelectCb(Walker *pWalker, Select *p){
  if( p->selFlags & (SF_View|SF_CopyCte) ){
    testcase( p->selFlags & SF_View );
    testcase( p->selFlags & SF_CopyCte );
    return WRC_Prune;
  }
  renameWalkWith(pWalker, p);
  return WRC_Continue;
}